

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperEQFailure<char[680],std::__cxx11::string>
          (internal *this,char *lhs_expression,char *rhs_expression,char (*lhs) [680],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar1;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs_local;
  char (*lhs_local) [680];
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  local_30 = rhs;
  rhs_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs;
  lhs_local = (char (*) [680])rhs_expression;
  rhs_expression_local = lhs_expression;
  lhs_expression_local = (char *)this;
  FormatForComparisonFailureMessage<char[680],std::__cxx11::string>
            (&local_50,(internal *)lhs,(char (*) [680])rhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs);
  FormatForComparisonFailureMessage<std::__cxx11::string,char[680]>
            (&local_70,(internal *)local_30,rhs_local,lhs);
  EqFailure(this,lhs_expression,rhs_expression,&local_50,&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  AVar1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression, const T1& lhs,
                                   const T2& rhs) {
  return EqFailure(lhs_expression, rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs), false);
}